

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw-pause.c
# Opt level: O2

void cw_pause_close(Curl_easy *data,Curl_cwriter *writer)

{
  void *pvVar1;
  cw_pause_buf *pcVar2;
  cw_pause_buf *cwbuf;
  
  pvVar1 = writer->ctx;
  cwbuf = *(cw_pause_buf **)((long)pvVar1 + 0x20);
  while (cwbuf != (cw_pause_buf *)0x0) {
    pcVar2 = cwbuf->next;
    cw_pause_buf_free(cwbuf);
    *(cw_pause_buf **)((long)pvVar1 + 0x20) = pcVar2;
    cwbuf = pcVar2;
  }
  return;
}

Assistant:

static void cw_pause_close(struct Curl_easy *data, struct Curl_cwriter *writer)
{
  struct cw_pause_ctx *ctx = writer->ctx;

  (void)data;
  cw_pause_bufs_free(ctx);
}